

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O1

bool __thiscall
lunasvg::SVGPreserveAspectRatio::parse(SVGPreserveAspectRatio *this,string_view input)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  ulong uVar5;
  undefined4 uVar6;
  MeetOrSlice MVar7;
  ulong uVar8;
  MeetOrSlice MVar9;
  
  pbVar4 = (byte *)input._M_str;
  uVar5 = input._M_len;
  if (uVar5 != 0) {
    pbVar1 = pbVar4 + uVar5;
    do {
      if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))
      goto LAB_0011ffba;
      pbVar4 = pbVar4 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    uVar5 = 0;
    pbVar4 = pbVar1;
  }
LAB_0011ffba:
  uVar6 = 0;
  if ((uVar5 < 4) || (*(int *)pbVar4 != 0x656e6f6e)) {
    bVar3 = false;
  }
  else {
    pbVar4 = pbVar4 + 4;
    uVar5 = uVar5 - 4;
    bVar3 = true;
  }
  if (!bVar3) {
    if ((uVar5 < 8) || (*(long *)pbVar4 != 0x6e694d596e694d78)) {
      bVar2 = false;
    }
    else {
      pbVar4 = pbVar4 + 8;
      uVar5 = uVar5 - 8;
      bVar2 = true;
    }
    uVar6 = 1;
    if (!bVar2) {
      if ((uVar5 < 8) || (*(long *)pbVar4 != 0x6e694d5964694d78)) {
        bVar2 = false;
      }
      else {
        pbVar4 = pbVar4 + 8;
        uVar5 = uVar5 - 8;
        bVar2 = true;
      }
      uVar6 = 2;
      if (!bVar2) {
        if ((uVar5 < 8) || (*(long *)pbVar4 != 0x6e694d5978614d78)) {
          bVar2 = false;
        }
        else {
          pbVar4 = pbVar4 + 8;
          uVar5 = uVar5 - 8;
          bVar2 = true;
        }
        uVar6 = 3;
        if (!bVar2) {
          if ((uVar5 < 8) || (*(long *)pbVar4 != 0x64694d596e694d78)) {
            bVar2 = false;
          }
          else {
            pbVar4 = pbVar4 + 8;
            uVar5 = uVar5 - 8;
            bVar2 = true;
          }
          uVar6 = 4;
          if (!bVar2) {
            if ((uVar5 < 8) || (*(long *)pbVar4 != 0x64694d5964694d78)) {
              bVar2 = false;
            }
            else {
              pbVar4 = pbVar4 + 8;
              uVar5 = uVar5 - 8;
              bVar2 = true;
            }
            uVar6 = 5;
            if (!bVar2) {
              if ((uVar5 < 8) || (*(long *)pbVar4 != 0x64694d5978614d78)) {
                bVar2 = false;
              }
              else {
                pbVar4 = pbVar4 + 8;
                uVar5 = uVar5 - 8;
                bVar2 = true;
              }
              uVar6 = 6;
              if (!bVar2) {
                if ((uVar5 < 8) || (*(long *)pbVar4 != 0x78614d596e694d78)) {
                  bVar2 = false;
                }
                else {
                  pbVar4 = pbVar4 + 8;
                  uVar5 = uVar5 - 8;
                  bVar2 = true;
                }
                uVar6 = 7;
                if (!bVar2) {
                  if ((uVar5 < 8) || (*(long *)pbVar4 != 0x78614d5964694d78)) {
                    bVar2 = false;
                  }
                  else {
                    pbVar4 = pbVar4 + 8;
                    uVar5 = uVar5 - 8;
                    bVar2 = true;
                  }
                  uVar6 = 8;
                  if (!bVar2) {
                    if ((uVar5 < 8) || (*(long *)pbVar4 != 0x78614d5978614d78)) {
                      bVar2 = false;
                    }
                    else {
                      pbVar4 = pbVar4 + 8;
                      uVar5 = uVar5 - 8;
                      bVar2 = true;
                    }
                    uVar6 = 9;
                    if (!bVar2) {
                      return false;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (uVar5 != 0) {
    pbVar1 = pbVar4 + uVar5;
    do {
      if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))
      goto LAB_001201a4;
      pbVar4 = pbVar4 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    uVar5 = 0;
    pbVar4 = pbVar1;
  }
LAB_001201a4:
  if ((uVar5 < 4) || (*(int *)pbVar4 != 0x7465656d)) {
    bVar2 = false;
  }
  else {
    pbVar4 = pbVar4 + 4;
    uVar5 = uVar5 - 4;
    bVar2 = true;
  }
  MVar7 = Meet;
  if ((4 < uVar5 && !bVar2) && (MVar7 = Meet, pbVar4[4] == 0x65 && *(int *)pbVar4 == 0x63696c73)) {
    pbVar4 = pbVar4 + 5;
    uVar5 = uVar5 - 5;
    MVar7 = Slice;
  }
  MVar9 = Meet;
  if (!bVar3) {
    MVar9 = MVar7;
  }
  if (uVar5 != 0) {
    uVar8 = 0;
    do {
      bVar3 = false;
      if ((0x20 < (ulong)pbVar4[uVar8]) ||
         (bVar3 = false, (0x100002600U >> ((ulong)pbVar4[uVar8] & 0x3f) & 1) == 0))
      goto LAB_0012021c;
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  bVar3 = true;
LAB_0012021c:
  if (bVar3 != false) {
    *(undefined4 *)&(this->super_SVGProperty).field_0xc = uVar6;
    this->m_meetOrSlice = MVar9;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool SVGPreserveAspectRatio::parse(std::string_view input)
{
    auto alignType = AlignType::xMidYMid;
    stripLeadingSpaces(input);
    if(skipString(input, "none"))
        alignType = AlignType::None;
    else if(skipString(input, "xMinYMin"))
        alignType = AlignType::xMinYMin;
    else if(skipString(input, "xMidYMin"))
        alignType = AlignType::xMidYMin;
    else if(skipString(input, "xMaxYMin"))
        alignType = AlignType::xMaxYMin;
    else if(skipString(input, "xMinYMid"))
        alignType = AlignType::xMinYMid;
    else if(skipString(input, "xMidYMid"))
        alignType = AlignType::xMidYMid;
    else if(skipString(input, "xMaxYMid"))
        alignType = AlignType::xMaxYMid;
    else if(skipString(input, "xMinYMax"))
        alignType = AlignType::xMinYMax;
    else if(skipString(input, "xMidYMax"))
        alignType = AlignType::xMidYMax;
    else if(skipString(input, "xMaxYMax"))
        alignType = AlignType::xMaxYMax;
    else {
        return false;
    }

    auto meetOrSlice = MeetOrSlice::Meet;
    skipOptionalSpaces(input);
    if(skipString(input, "meet")) {
        meetOrSlice = MeetOrSlice::Meet;
    } else if(skipString(input, "slice")) {
        meetOrSlice = MeetOrSlice::Slice;
    }

    if(alignType == AlignType::None)
        meetOrSlice = MeetOrSlice::Meet;
    skipOptionalSpaces(input);
    if(!input.empty())
        return false;
    m_alignType = alignType;
    m_meetOrSlice = meetOrSlice;
    return true;
}